

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::
basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
::write_byte_string(basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
                    *this,byte_string_view *b)

{
  size_t sVar1;
  const_iterator puVar2;
  const_iterator puVar3;
  byte_string_view *in_RSI;
  uint8_t c;
  const_iterator __end3;
  const_iterator __begin3;
  byte_string_view *__range3;
  undefined7 in_stack_ffffffffffffff68;
  uint8_t in_stack_ffffffffffffff6f;
  bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_ffffffffffffff70;
  unsigned_short in_stack_ffffffffffffff8e;
  uchar uVar4;
  back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  in_stack_ffffffffffffff90;
  unsigned_long in_stack_ffffffffffffff98;
  uint val;
  back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  in_stack_ffffffffffffffa0;
  
  sVar1 = byte_string_view::size(in_RSI);
  if (sVar1 < 0x18) {
    byte_string_view::size(in_RSI);
    uVar4 = (uchar)(in_stack_ffffffffffffff8e >> 8);
    std::
    back_inserter<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
              (uVar4,in_stack_ffffffffffffff90);
  }
  else {
    sVar1 = byte_string_view::size(in_RSI);
    if (sVar1 < 0x100) {
      std::
      back_inserter<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
                 CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      uVar4 = (uchar)(in_stack_ffffffffffffff8e >> 8);
      binary::
      native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                (uVar4,in_stack_ffffffffffffff90);
      byte_string_view::size(in_RSI);
      std::
      back_inserter<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
                 CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      binary::
      native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                (uVar4,in_stack_ffffffffffffff90);
    }
    else {
      sVar1 = byte_string_view::size(in_RSI);
      if (sVar1 < 0x10000) {
        std::
        back_inserter<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
                   CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
        binary::
        native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                  ((uchar)(in_stack_ffffffffffffff8e >> 8),in_stack_ffffffffffffff90);
        byte_string_view::size(in_RSI);
        std::
        back_inserter<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
                   CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
        binary::
        native_to_big<unsigned_short,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                  (in_stack_ffffffffffffff8e,in_stack_ffffffffffffff90);
      }
      else {
        sVar1 = byte_string_view::size(in_RSI);
        uVar4 = (uchar)(in_stack_ffffffffffffff8e >> 8);
        if (sVar1 < 0x100000000) {
          std::
          back_inserter<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *
                     )CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          val = (uint)(in_stack_ffffffffffffff98 >> 0x20);
          binary::
          native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                    (uVar4,in_stack_ffffffffffffff90);
          byte_string_view::size(in_RSI);
          std::
          back_inserter<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *
                     )CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          binary::
          native_to_big<unsigned_int,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                    (val,in_stack_ffffffffffffffa0);
        }
        else {
          std::
          back_inserter<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *
                     )CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          binary::
          native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                    (uVar4,in_stack_ffffffffffffff90);
          in_stack_ffffffffffffff70 =
               (bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)
               byte_string_view::size(in_RSI);
          std::
          back_inserter<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *
                     )CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          binary::
          native_to_big<unsigned_long,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
        }
      }
    }
  }
  puVar2 = byte_string_view::begin(in_RSI);
  puVar3 = byte_string_view::end(in_RSI);
  for (; puVar2 != puVar3; puVar2 = puVar2 + 1) {
    bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f);
  }
  return;
}

Assistant:

void write_byte_string(const byte_string_view& b) 
    {
        if (b.size() <= 0x17)
        {
            // fixstr stores a byte array whose length is upto 31 bytes
            binary::native_to_big(static_cast<uint8_t>(0x40 + b.size()), 
                                            std::back_inserter(sink_));
        }
        else if (b.size() <= 0xff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x58), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint8_t>(b.size()), 
                                            std::back_inserter(sink_));
        }
        else if (b.size() <= 0xffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x59), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint16_t>(b.size()), 
                                            std::back_inserter(sink_));
        }
        else if (b.size() <= 0xffffffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x5a), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint32_t>(b.size()), 
                                            std::back_inserter(sink_));
        }
        else // if (b.size() <= 0xffffffffffffffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x5b), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint64_t>(b.size()), 
                                            std::back_inserter(sink_));
        }

        for (auto c : b)
        {
            sink_.push_back(c);
        }
    }